

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  uVar1 = (a->x).n[0];
  uVar2 = (a->x).n[1];
  uVar3 = (a->x).n[2];
  uVar4 = (a->x).n[3];
  iVar5 = (a->x).magnitude;
  iVar6 = (a->x).normalized;
  (r->x).n[4] = (a->x).n[4];
  (r->x).magnitude = iVar5;
  (r->x).normalized = iVar6;
  (r->x).n[2] = uVar3;
  (r->x).n[3] = uVar4;
  (r->x).n[0] = uVar1;
  (r->x).n[1] = uVar2;
  r_00 = &r->y;
  uVar1 = (a->y).n[1];
  uVar2 = (a->y).n[2];
  uVar3 = (a->y).n[3];
  uVar4 = (a->y).n[4];
  iVar5 = (a->y).magnitude;
  iVar6 = (a->y).normalized;
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar1;
  (r->y).n[2] = uVar2;
  (r->y).n[3] = uVar3;
  (r->y).n[4] = uVar4;
  (r->y).magnitude = iVar5;
  (r->y).normalized = iVar6;
  uVar1 = (a->z).n[1];
  uVar2 = (a->z).n[2];
  uVar3 = (a->z).n[3];
  uVar4 = (a->z).n[4];
  iVar5 = (a->z).magnitude;
  iVar6 = (a->z).normalized;
  (r->z).n[0] = (a->z).n[0];
  (r->z).n[1] = uVar1;
  (r->z).n[2] = uVar2;
  (r->z).n[3] = uVar3;
  (r->z).n[4] = uVar4;
  (r->z).magnitude = iVar5;
  (r->z).normalized = iVar6;
  secp256k1_fe_normalize_weak(r_00);
  secp256k1_fe_negate_unchecked(r_00,r_00,1);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GEJ_VERIFY(r);
}